

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void __thiscall
duckdb::ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_>::ModeAdd
          (ModeState<duckdb::uhugeint_t,_duckdb::ModeStandard<duckdb::uhugeint_t>_> *this,idx_t row)

{
  ulong uVar1;
  ColumnDataScanState *pCVar2;
  size_t sVar3;
  uint64_t uVar4;
  reference pvVar5;
  mapped_type *pmVar6;
  uhugeint_t *puVar7;
  ulong uVar8;
  key_type *__k;
  
  pCVar2 = this->scan;
  if ((pCVar2->next_row_index <= row) || (row < pCVar2->current_row_index)) {
    duckdb::ColumnDataCollection::Seek
              ((ulong)this->inputs,(ColumnDataScanState *)row,(DataChunk *)pCVar2);
    pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    this->data = *(uhugeint_t **)(pvVar5 + 0x20);
    pvVar5 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)&this->page,0)
    ;
    FlatVector::VerifyFlatVector(pvVar5);
    this->validity = (ValidityMask *)(pvVar5 + 0x28);
  }
  __k = this->data + (uint)((int)row - (int)this->scan->current_row_index);
  pmVar6 = std::__detail::
           _Map_base<duckdb::uhugeint_t,_std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::uhugeint_t>,_std::hash<duckdb::uhugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::uhugeint_t,_std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>,_std::allocator<std::pair<const_duckdb::uhugeint_t,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::uhugeint_t>,_std::hash<duckdb::uhugeint_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this->frequency_map,__k);
  sVar3 = pmVar6->count;
  uVar1 = sVar3 + 1;
  pmVar6->count = uVar1;
  if (sVar3 == 0) {
    this->nonzero = this->nonzero + 1;
    pmVar6->first_row = row;
  }
  else {
    uVar8 = pmVar6->first_row;
    if (row < pmVar6->first_row) {
      uVar8 = row;
    }
    pmVar6->first_row = uVar8;
  }
  if (this->count < uVar1) {
    this->valid = true;
    this->count = uVar1;
    puVar7 = this->mode;
    if (puVar7 == (uhugeint_t *)0x0) {
      puVar7 = (uhugeint_t *)operator_new(0x10);
      uVar4 = __k->upper;
      puVar7->lower = __k->lower;
      puVar7->upper = uVar4;
      this->mode = puVar7;
    }
    else {
      uVar4 = __k->upper;
      puVar7->lower = __k->lower;
      puVar7->upper = uVar4;
    }
  }
  return;
}

Assistant:

void ModeAdd(idx_t row) {
		const auto &key = GetCell(row);
		auto &attr = (*frequency_map)[key];
		auto new_count = (attr.count += 1);
		if (new_count == 1) {
			++nonzero;
			attr.first_row = row;
		} else {
			attr.first_row = MinValue(row, attr.first_row);
		}
		if (new_count > count) {
			valid = true;
			count = new_count;
			if (mode) {
				*mode = key;
			} else {
				mode = new KEY_TYPE(key);
			}
		}
	}